

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O1

void __thiscall
SuiteTimeRangeTests::TestisInSameRangeWithDay::RunImpl(TestisInSameRangeWithDay *this)

{
  TestResults *pTVar1;
  char cVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_9b0;
  DateTime local_990;
  DateTime local_978;
  DateTime local_960;
  DateTime local_948;
  DateTime local_930;
  DateTime local_918;
  DateTime local_900;
  DateTime local_8e8;
  DateTime local_8d0;
  DateTime local_8b8;
  DateTime local_8a0;
  DateTime local_888;
  DateTime local_870;
  DateTime local_858;
  DateTime local_840;
  DateTime local_828;
  DateTime local_810;
  DateTime local_7f8;
  DateTime local_7e0;
  DateTime local_7c8;
  DateTime local_7b0;
  DateTime local_798;
  DateTime local_780;
  DateTime local_768;
  DateTime local_750;
  DateTime local_738;
  DateTime local_720;
  DateTime local_708;
  DateTime local_6f0;
  DateTime local_6d8;
  DateTime local_6c0;
  DateTime local_6a8;
  DateTime local_690;
  DateTime local_678;
  DateTime local_660;
  DateTime local_648;
  DateTime local_630;
  DateTime local_618;
  DateTime local_600;
  DateTime local_5e8;
  DateTime local_5d0;
  DateTime local_5b8;
  DateTime local_5a0;
  DateTime local_588;
  DateTime local_570;
  DateTime local_558;
  DateTime local_540;
  DateTime local_528;
  DateTime local_510;
  DateTime local_4f8;
  DateTime local_4e0;
  DateTime local_4c8;
  DateTime local_4b0;
  DateTime local_498;
  DateTime local_480;
  DateTime local_468;
  DateTime local_450;
  DateTime local_438;
  DateTime local_420;
  DateTime local_408;
  DateTime local_3f0;
  DateTime local_3d8;
  DateTime local_3c0;
  DateTime local_3a8;
  DateTime local_390;
  DateTime local_378;
  DateTime local_360;
  DateTime local_348;
  DateTime local_330;
  DateTime local_318;
  DateTime local_300;
  DateTime local_2e8;
  DateTime local_2d0;
  DateTime local_2b8;
  DateTime local_2a0;
  DateTime local_288;
  DateTime local_270;
  DateTime local_258;
  DateTime local_240;
  DateTime local_228;
  DateTime local_210;
  DateTime local_1f8;
  DateTime local_1e0;
  DateTime local_1c8;
  DateTime local_1b0;
  DateTime local_198;
  DateTime local_180;
  DateTime local_168;
  DateTime local_150;
  DateTime local_138;
  DateTime local_120;
  DateTime local_108;
  DateTime local_f0;
  DateTime local_d8;
  DateTime local_c0;
  DateTime local_a8;
  DateTime local_90;
  DateTime local_78;
  DateTime local_60;
  DateTime local_48;
  
  local_948._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_948.m_date = 0;
  local_948.m_time = 10800000000000;
  local_960._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_960.m_date = 0;
  local_960.m_time = 64800000000000;
  local_978._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_978.m_date = 0x256ede;
  local_978.m_time = 10800000000000;
  local_990._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_990.m_date = 0x256edc;
  local_990.m_time = 10800000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_948,&local_960,2,5,&local_978,&local_990);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x112);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "!TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  local_8e8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_8e8.m_date = 0;
  local_8e8.m_time = 10800000000000;
  local_900._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_900.m_date = 0;
  local_900.m_time = 64800000000000;
  local_918._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_918.m_date = 0x256ee2;
  local_918.m_time = 10800000000000;
  local_930._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_930.m_date = 0x256ede;
  local_930.m_time = 10800000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_8e8,&local_900,2,5,&local_918,&local_930);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x117);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "!TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  local_888._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_888.m_date = 0;
  local_888.m_time = 10800000000000;
  local_8a0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_8a0.m_date = 0;
  local_8a0.m_time = 64800000000000;
  local_8b8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_8b8.m_date = 0x256ede;
  local_8b8.m_time = 10800000000000;
  local_8d0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_8d0.m_date = 0x256ede;
  local_8d0.m_time = 10800000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_888,&local_8a0,2,5,&local_8b8,&local_8d0);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x11c);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  local_828._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_828.m_date = 0;
  local_828.m_time = 10800000000000;
  local_840._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_840.m_date = 0;
  local_840.m_time = 64800000000000;
  local_858._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_858.m_date = 0x256edd;
  local_858.m_time = 36000000000000;
  local_870._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_870.m_date = 0x256ede;
  local_870.m_time = 10800000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_828,&local_840,2,5,&local_858,&local_870);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x121);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  local_7c8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_7c8.m_date = 0;
  local_7c8.m_time = 10800000000000;
  local_7e0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_7e0.m_date = 0;
  local_7e0.m_time = 64800000000000;
  local_7f8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_7f8.m_date = 0x256ede;
  local_7f8.m_time = 36000000000000;
  local_810._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_810.m_date = 0x256ee0;
  local_810.m_time = 7200000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_7c8,&local_7e0,2,5,&local_7f8,&local_810);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x126);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  local_768._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_768.m_date = 0;
  local_768.m_time = 10800000000000;
  local_780._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_780.m_date = 0;
  local_780.m_time = 64800000000000;
  local_798._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_798.m_date = 0x256ede;
  local_798.m_time = 36000000000000;
  local_7b0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_7b0.m_date = 0x256ed7;
  local_7b0.m_time = 10800000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_768,&local_780,2,5,&local_798,&local_7b0);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,299);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "!TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  local_708._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_708.m_date = 0;
  local_708.m_time = 10800000000000;
  local_720._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_720.m_date = 0;
  local_720.m_time = 64800000000000;
  local_738._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_738.m_date = 0x256ede;
  local_738.m_time = 7200000000000;
  local_750._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_750.m_date = 0x256ed7;
  local_750.m_time = 10800000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_708,&local_720,2,5,&local_738,&local_750);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x130);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "!TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  local_6a8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_6a8.m_date = 0;
  local_6a8.m_time = 10800000000000;
  local_6c0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_6c0.m_date = 0;
  local_6c0.m_time = 64800000000000;
  local_6d8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_6d8.m_date = 0x256edd;
  local_6d8.m_time = 7200000000000;
  local_6f0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_6f0.m_date = 0x256ed6;
  local_6f0.m_time = 10800000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_6a8,&local_6c0,2,5,&local_6d8,&local_6f0);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x135);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "!TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  local_648._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_648.m_date = 0;
  local_648.m_time = 300000000000;
  local_660._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_660.m_date = 0;
  local_660.m_time = 85500000000000;
  local_678._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_678.m_date = 0x257146;
  local_678.m_time = 0;
  local_690._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_690.m_date = 0x257145;
  local_690.m_time = 3600000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_648,&local_660,1,7,&local_678,&local_690);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x142);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_5e8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_5e8.m_date = 0;
  local_5e8.m_time = 300000000000;
  local_600._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_600.m_date = 0;
  local_600.m_time = 85500000000000;
  local_618._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_618.m_date = 0x257217;
  local_618.m_time = 0;
  local_630._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_630.m_date = 0x257218;
  local_630.m_time = 3600000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_5e8,&local_600,1,7,&local_618,&local_630);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x147);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_588._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_588.m_date = 0;
  local_588.m_time = 300000000000;
  local_5a0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_5a0.m_date = 0;
  local_5a0.m_time = 85500000000000;
  local_5b8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_5b8.m_date = 0x257255;
  local_5b8.m_time = 0x214bee0b9400;
  local_5d0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_5d0.m_date = 0x257256;
  local_5d0.m_time = 0x214bee0b9400;
  cVar2 = FIX::TimeRange::isInSameRange(&local_588,&local_5a0,1,7,&local_5b8,&local_5d0);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x14c);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_528._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_528.m_date = 0;
  local_528.m_time = 300000000000;
  local_540._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_540.m_date = 0;
  local_540.m_time = 85500000000000;
  local_558._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_558.m_date = 0x257255;
  local_558.m_time = 0x214bee0b9400;
  local_570._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_570.m_date = 0x257256;
  local_570.m_time = 0x214bee0b9400;
  cVar2 = FIX::TimeRange::isInSameRange(&local_528,&local_540,-1,-1,&local_558,&local_570);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x151);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_4c8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_4c8.m_date = 0;
  local_4c8.m_time = 80900000000000;
  local_4e0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_4e0.m_date = 0;
  local_4e0.m_time = 0x499081b15200;
  local_4f8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_4f8.m_date = 0x2584f1;
  local_4f8.m_time = 0x498fcee0f400;
  local_510._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_510.m_date = 0x2584f1;
  local_510.m_time = 0x49b639a52600;
  cVar2 = FIX::TimeRange::isInSameRange(&local_4c8,&local_4e0,5,5,&local_4f8,&local_510);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x159);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_468._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_468.m_date = 0;
  local_468.m_time = 0x4957768e0000;
  local_480._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_480.m_date = 0;
  local_480.m_time = 0x48e0b82f9400;
  local_498._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_498.m_date = 0x2584f0;
  local_498.m_time = 0x3bc4773b3e00;
  local_4b0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_4b0.m_date = 0x2584f1;
  local_4b0.m_time = 0x49780f347800;
  cVar2 = FIX::TimeRange::isInSameRange(&local_468,&local_480,5,5,&local_498,&local_4b0);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x15f);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_408._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_408.m_date = 0;
  local_408.m_time = 0x1d85aec4f800;
  local_420._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_420.m_date = 0;
  local_420.m_time = 0x1d69be364800;
  local_438._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_438.m_date = 0x257239;
  local_438.m_time = 0x1d85aec4f800;
  local_450._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_450.m_date = 0x257239;
  local_450.m_time = 0x1d85aec4f800;
  cVar2 = FIX::TimeRange::isInSameRange(&local_408,&local_420,1,1,&local_438,&local_450);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x168);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_3a8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_3a8.m_date = 0;
  local_3a8.m_time = 0x1d85aec4f800;
  local_3c0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_3c0.m_date = 0;
  local_3c0.m_time = 0x1d69be364800;
  local_3d8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_3d8.m_date = 0x257239;
  local_3d8.m_time = 0x1d85aec4f800;
  local_3f0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_3f0.m_date = 0x257240;
  local_3f0.m_time = 0x1d85aec4f800;
  cVar2 = FIX::TimeRange::isInSameRange(&local_3a8,&local_3c0,1,1,&local_3d8,&local_3f0);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x16a);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_348._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_348.m_date = 0;
  local_348.m_time = 0x1d85aec4f800;
  local_360._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_360.m_date = 0;
  local_360.m_time = 0x1d69be364800;
  local_378._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_378.m_date = 0x257239;
  local_378.m_time = 0x1d85aec4f800;
  local_390._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_390.m_date = 0x25723a;
  local_390.m_time = 0x1d85aec4f800;
  cVar2 = FIX::TimeRange::isInSameRange(&local_348,&local_360,1,1,&local_378,&local_390);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x16c);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_2e8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_2e8.m_date = 0;
  local_2e8.m_time = 0x1d85aec4f800;
  local_300._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_300.m_date = 0;
  local_300.m_time = 0x1d69be364800;
  local_318._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_318.m_date = 0x257239;
  local_318.m_time = 0x20cbdf7d9800;
  local_330._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_330.m_date = 0x257240;
  local_330.m_time = 0x1d85aec4f800;
  cVar2 = FIX::TimeRange::isInSameRange(&local_2e8,&local_300,1,1,&local_318,&local_330);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x170);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_288._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_288.m_date = 0;
  local_288.m_time = 0x1d85aec4f800;
  local_2a0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_2a0.m_date = 0;
  local_2a0.m_time = 0x1d69be364800;
  local_2b8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_2b8.m_date = 0x257239;
  local_2b8.m_time = 0x20cbdf7d9800;
  local_2d0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_2d0.m_date = 0x257240;
  local_2d0.m_time = 0x1a3f7e0c5800;
  cVar2 = FIX::TimeRange::isInSameRange(&local_288,&local_2a0,1,1,&local_2b8,&local_2d0);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x172);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_228._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_228.m_date = 0;
  local_228.m_time = 0x1d85aec4f800;
  local_240._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_240.m_date = 0;
  local_240.m_time = 0x1d69be364800;
  local_258._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_258.m_date = 0x257239;
  local_258.m_time = 0x20cbdf7d9800;
  local_270._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_270.m_date = 0x25723b;
  local_270.m_time = 0x1a3f7e0c5800;
  cVar2 = FIX::TimeRange::isInSameRange(&local_228,&local_240,1,1,&local_258,&local_270);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x174);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_1c8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_1c8.m_date = 0;
  local_1c8.m_time = 0x1d85aec4f800;
  local_1e0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_1e0.m_date = 0;
  local_1e0.m_time = 0x1d69be364800;
  local_1f8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_1f8.m_date = 0x257239;
  local_1f8.m_time = 0x1d85aec4f800;
  local_210._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_210.m_date = 0x25723b;
  local_210.m_time = 0x1d85aec4f800;
  cVar2 = FIX::TimeRange::isInSameRange(&local_1c8,&local_1e0,2,2,&local_1f8,&local_210);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x17d);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_168._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_168.m_date = 0;
  local_168.m_time = 0x1d85aec4f800;
  local_180._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_180.m_date = 0;
  local_180.m_time = 0x1d69be364800;
  local_198._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_198.m_date = 0x257239;
  local_198.m_time = 0x1d85aec4f800;
  local_1b0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_1b0.m_date = 0x257241;
  local_1b0.m_time = 0x1d85aec4f800;
  cVar2 = FIX::TimeRange::isInSameRange(&local_168,&local_180,2,2,&local_198,&local_1b0);
  if (cVar2 != '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x17f);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_108._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_108.m_date = 0;
  local_108.m_time = 0x1d85aec4f800;
  local_120._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_120.m_date = 0;
  local_120.m_time = 0x1d69be364800;
  local_138._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_138.m_date = 0x257239;
  local_138.m_time = 0x1d85aec4f800;
  local_150._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_150.m_date = 0x257239;
  local_150.m_time = 0x1a3f7e0c5800;
  cVar2 = FIX::TimeRange::isInSameRange(&local_108,&local_120,2,2,&local_138,&local_150);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x181);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_a8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_a8.m_date = 0;
  local_a8.m_time = 61200000000000;
  local_c0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_c0.m_date = 0;
  local_c0.m_time = 0x3485f83c5c00;
  local_d8._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_d8.m_date = 0x2584f2;
  local_d8.m_time = 0x4b86f4841e00;
  local_f0._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_f0.m_date = 0x2584f4;
  local_f0.m_time = 21600000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_a8,&local_c0,2,2,&local_d8,&local_f0);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x18a);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  local_48._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_48.m_date = 0;
  local_48.m_time = 61200000000000;
  local_60._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_60.m_date = 0;
  local_60.m_time = 0x3485f83c5c00;
  local_78._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_78.m_date = 0x2584f2;
  local_78.m_time = 0x4b86f4841e00;
  local_90._vptr_DateTime = (_func_int **)&PTR__DateTime_003263b0;
  local_90.m_date = 0x2584f5;
  local_90.m_time = 21600000000000;
  cVar2 = FIX::TimeRange::isInSameRange(&local_48,&local_60,4,4,&local_78,&local_90);
  if (cVar2 == '\0') {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9b0,*ppTVar4,0x192);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9b0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  return;
}

Assistant:

TEST(isInSameRangeWithDay)
{
  UtcTimeOnly startTime( 3, 0, 0 );
  UtcTimeOnly endTime( 18, 0, 0 );
  int startDay = 2;
  int endDay = 5;

  UtcTimeStamp time1( 3, 0, 0, 27, 7, 2004 );
  UtcTimeStamp time2( 3, 0, 0, 25, 7, 2004 );
  CHECK( !TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 3, 0, 0, 31, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 27, 7, 2004 );
  CHECK( !TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 3, 0, 0, 27, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 27, 7, 2004 );
  CHECK( TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 10, 0, 0, 26, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 27, 7, 2004 );
  CHECK( TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 10, 0, 0, 27, 7, 2004 );
  time2 = UtcTimeStamp( 2, 0, 0, 29, 7, 2004 );
  CHECK( TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 10, 0, 0, 27, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 20, 7, 2004 );
  CHECK( !TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 2, 0, 0, 27, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 20, 7, 2004 );
  CHECK( !TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 2, 0, 0, 26, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 19, 7, 2004 );
  CHECK( !TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  // Reset start/end time so that they fall within an hour of midnight
  startTime = UtcTimeOnly(0, 5, 0);
  endTime = UtcTimeOnly(23, 45, 0);

  // Make it a week-long session
  startDay = 1;
  endDay = 7;

  // Check that ST-->DST (Sunday is missing one hour) is handled
  time1 = UtcTimeStamp(0, 0, 0, 4, 4, 2006);
  time2 = UtcTimeStamp(1, 0, 0, 3, 4, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Check that DST-->ST (Sunday has an extra hour) is handled
  time1 = UtcTimeStamp(0, 0, 0, 30, 10, 2006);
  time2 = UtcTimeStamp(1, 0, 0, 31, 10, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Check that everything works across a year boundary
  time1 = UtcTimeStamp(10, 10, 10, 31, 12, 2006);
  time2 = UtcTimeStamp(10, 10, 10, 1, 1, 2007);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Check that "missing" start and end days are handled as isSameSession without days
  startDay = -1;
  endDay = -1;
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  startDay = 5;
  endDay = 5;
  startTime = UtcTimeOnly(22, 28, 20);
  endTime = UtcTimeOnly(22, 28, 5);
  time1 = UtcTimeStamp(22, 28, 2, 16, 1, 2020); // session
  time2 = UtcTimeStamp(22, 30, 47, 16, 1, 2020); // date
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  startTime = UtcTimeOnly(22, 24, 0);
  endTime = UtcTimeOnly(22, 15, 30);
  time1 = UtcTimeStamp(18, 15, 15, 15, 1, 2020); // session
  time2 = UtcTimeStamp(22, 26, 20, 16, 1, 2020); // date
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Session days are the same
  startDay = 1;
  endDay = 1;
  startTime = UtcTimeOnly(9, 1, 0);
  endTime = UtcTimeOnly(8, 59, 0);
  time1 = UtcTimeStamp(9, 1, 0, 3, 12, 2006);
  time2 = UtcTimeStamp(9, 1, 0, 3, 12, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(9, 1, 0, 10, 12, 2006);
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(9, 1, 0, 4, 12, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  time1 = UtcTimeStamp(10, 1, 0, 3, 12, 2006);
  time2 = UtcTimeStamp(9, 1, 0, 10, 12, 2006);
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(8, 1, 0, 10, 12, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(8, 1, 0, 5, 12, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Session days are the same, and not today
  startDay = 2;
  endDay = 2;
  startTime = UtcTimeOnly(9, 1, 0);
  endTime = UtcTimeOnly(8, 59, 0);
  time1 = UtcTimeStamp(9, 1, 0, 3, 12, 2006); // day before swap
  time2 = UtcTimeStamp(9, 1, 0, 5, 12, 2006);
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(9, 1, 0, 11, 12, 2006);
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(8, 1, 0, 3, 12, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Re-creating weekend cert reset
  startDay = 2;
  endDay = 2;
  startTime = UtcTimeOnly(17, 0, 0);
  endTime = UtcTimeOnly(16, 02, 30);
  time1 = UtcTimeStamp(23, 4, 3, 17, 1, 2020); // 20200117-23:04:03.008 -> H M S, D M Y
  time2 = UtcTimeStamp(6, 0, 0, 19, 1, 2020); // 20200119-06:00:00
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  startDay = 4;
  endDay = 4;
  startTime = UtcTimeOnly(17, 0, 0);
  endTime = UtcTimeOnly(16, 02, 30);
  time1 = UtcTimeStamp(23, 4, 3, 17, 1, 2020); // 20200117-23:04:03.008 -> H M S, D M Y
  time2 = UtcTimeStamp(6, 0, 0, 20, 1, 2020); // 20200120-06:00:00
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
}